

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_primitives_conversion.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
skiwi::(anonymous_namespace)::make_let_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,int nr_args)

{
  uint64_t i_00;
  string *psVar1;
  reference original;
  string local_e0;
  int local_c0;
  undefined1 local_b9;
  int i;
  allocator<char> local_a1;
  string *local_a0;
  undefined1 local_98 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> temp;
  int nr_args_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *let_names;
  
  temp._M_elems[3].field_2._12_4_ = SUB84(this,0);
  if (4 < (int)temp._M_elems[3].field_2._12_4_) {
    __assert_fail("nr_args <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/inline_primitives_conversion.cpp"
                  ,0x22,"std::vector<std::string> skiwi::(anonymous namespace)::make_let_names(int)"
                 );
  }
  i._0_1_ = 1;
  local_a0 = (string *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"x",&local_a1);
  psVar1 = (string *)(temp._M_elems[0].field_2._M_local_buf + 8);
  local_a0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"y",(allocator<char> *)((long)&i + 3));
  psVar1 = (string *)(temp._M_elems[1].field_2._M_local_buf + 8);
  local_a0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"z",(allocator<char> *)((long)&i + 2));
  psVar1 = (string *)(temp._M_elems[2].field_2._M_local_buf + 8);
  local_a0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"w",(allocator<char> *)((long)&i + 1));
  i._0_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator(&local_a1);
  local_b9 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  for (local_c0 = 0; local_c0 < (int)temp._M_elems[3].field_2._12_4_; local_c0 = local_c0 + 1) {
    original = std::
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
               ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                             *)local_98,(long)local_c0);
    i_00 = g_alpha_conversion_index;
    g_alpha_conversion_index = g_alpha_conversion_index + 1;
    anon_unknown_2::make_name(&local_e0,original,i_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  local_b9 = 1;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> make_let_names(int nr_args)
    {
    assert(nr_args <= 4);
    std::array<std::string, 4> temp = { {"x", "y", "z", "w"} };
    std::vector<std::string> let_names;
    for (int i = 0; i < nr_args; ++i)
      {
      let_names.push_back(make_name(temp[i], g_alpha_conversion_index++));
      }
    return let_names;
    }